

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O3

Error asmjit::X86Internal::emitArgMove
                (X86Emitter *emitter,X86Reg *dst_,uint32_t dstTypeId,Operand_ *src_,
                uint32_t srcTypeId,bool avxEnabled,char *comment)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  undefined4 uVar4;
  Error EVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  uint32_t instId;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  X86Reg dst;
  anon_union_16_7_ed616b9d_for_Operand__0 local_48;
  anon_union_16_7_ed616b9d_for_Operand__0 local_38;
  
  if (dstTypeId == 0) {
    dstTypeId = (uint32_t)
                (byte)x86OpData[(ulong)((dst_->super_Reg).super_Operand.super_Operand_.field_0._any.
                                        signature >> 3 & 0x1f) + 0xa0];
  }
  if ((0x44 < dstTypeId - 0x20) || ((dstTypeId & 0x7e) == 0x20)) {
    emitArgMove();
LAB_001705d2:
    emitArgMove();
  }
  uVar3 = srcTypeId - 0x20;
  if ((0x44 < uVar3) || ((srcTypeId & 0x7e) == 0x20)) goto LAB_001705d2;
  local_38._packed[0] =
       (UInt64)*(undefined8 *)&(dst_->super_Reg).super_Operand.super_Operand_.field_0;
  local_38._mem.field_2 = (dst_->super_Reg).super_Operand.super_Operand_.field_0._mem.field_2;
  bVar1 = TypeId::_info[dstTypeId];
  bVar2 = TypeId::_info[srcTypeId];
  uVar10 = (uint)bVar2;
  local_48._packed[0] = (UInt64)*(undefined8 *)&src_->field_0;
  local_48._mem.field_2 = (src_->field_0)._mem.field_2;
  uVar8 = (uint)bVar1;
  uVar11 = (uint)bVar2;
  uVar9 = uVar10;
  if (dstTypeId - 0x20 < 10) {
    if (uVar3 < 10) {
      instId = 0x1a9;
      uVar3 = dstTypeId << 8 | srcTypeId;
      if ((int)uVar3 < 0x2822) {
        uVar9 = (uint)bVar2;
        if (((uVar3 == 0x2422) || (uVar9 = uVar10, uVar3 == 0x2622)) || (uVar3 == 0x2624))
        goto LAB_001704cd;
      }
      else {
        if ((uVar3 == 0x2822) || (uVar3 == 0x2824)) goto LAB_001704cd;
        if (uVar3 == 0x2826) {
          instId = 0x1aa;
          goto LAB_001704cd;
        }
      }
    }
    else if (((src_->field_0)._any.signature & 7) != 2) {
      if (uVar8 < uVar11) {
        bVar2 = bVar1;
      }
      uVar3 = (uint)bVar2;
      uVar9 = uVar3;
      if (1 < srcTypeId - 0x31) {
        if (srcTypeId - 0x2d < 4) {
          local_38._any.signature = 0x4000029;
          if (uVar3 == 1) {
            instId = 0x13f;
          }
          else if (uVar3 == 2) {
            instId = 0x142;
          }
          else {
            instId = uVar3 == 4 ^ 0x141;
            local_38._any.signature = 0x8000031;
            if (uVar3 < 5) {
              local_38._any.signature = 0x4000029;
            }
          }
        }
        else {
          if (0x31 < srcTypeId - 0x33) {
            return 4;
          }
          instId = 0x1a2;
          if (avxEnabled) {
            instId = 0x3f5;
          }
          uVar9 = 8;
          if (uVar3 != 8) {
            local_38._any.signature = 0x4000029;
            instId = 0x18d;
            uVar9 = uVar3;
            if (avxEnabled) {
              instId = 0x3df;
            }
          }
        }
        goto LAB_001704cd;
      }
      if (uVar3 != 8) {
        local_38._any.signature = 0x4000029;
        instId = 0x18d;
        goto LAB_001704cd;
      }
LAB_0017020f:
      instId = 0x1a2;
      uVar9 = 8;
      goto LAB_001704cd;
    }
    if ((bVar1 < 5) && (bVar2 < 4)) {
      local_38._any.signature = 0x4000029;
      instId = 0x1ad;
      uVar9 = uVar10;
      goto LAB_001704cd;
    }
    instId = 0x189;
    uVar9 = uVar8;
    if (uVar11 <= uVar8) {
      uVar9 = uVar11;
    }
    local_38._any.signature = 0x8000031;
    if (uVar9 == 4) {
      local_38._any.signature = 0x4000029;
    }
    uVar3 = local_48._any.signature & 7;
LAB_0017030a:
    uVar4 = local_38._any.signature;
    if (uVar3 != 1) goto LAB_001704cd;
LAB_00170313:
    local_48._any.signature = uVar4;
  }
  else {
    if (dstTypeId - 0x31 < 2) {
      uVar9 = (uint)bVar1;
      if ((uint)bVar2 <= (uint)bVar1) {
        uVar9 = (uint)bVar2;
      }
      if ((9 < uVar3) && ((local_48._any.signature & 7) != 2)) {
        instId = 0x1a2;
        if ((1 < srcTypeId - 0x31) && (instId = 399, 0x31 < srcTypeId - 0x33)) {
          return 4;
        }
        goto LAB_001704cd;
      }
      if (uVar9 == 8) goto LAB_0017020f;
      instId = 0x18d;
      uVar3 = local_48._any.signature & 7;
joined_r0x0017054f:
      if (uVar3 != 1) goto LAB_001704cd;
    }
    else {
      if (3 < dstTypeId - 0x2d) {
        if (0x31 < dstTypeId - 0x33) {
          return 4;
        }
        instId = 0x1a3;
        local_38._any.signature = 0x10000149;
        if (local_48._any.signature == 0x8000289) goto LAB_001704cd;
        if (TypeId::_info[(ulong)srcTypeId + 0x80] != '+' ||
            TypeId::_info[(ulong)dstTypeId + 0x80] != '*') {
          if (TypeId::_info[(ulong)srcTypeId + 0x80] == '*' &&
              TypeId::_info[(ulong)dstTypeId + 0x80] == '+') {
            uVar3 = uVar11 * 2;
            if (uVar8 <= uVar11 * 2) {
              uVar3 = (uint)bVar1;
            }
            uVar9 = uVar3 >> 1;
            uVar7 = 0x80;
            if (avxEnabled) {
              uVar7 = 800;
            }
            instId = 0x79;
            if (avxEnabled) {
              instId = 0x312;
            }
            if (uVar3 < 10) {
              instId = uVar7;
            }
            uVar6 = 0x40000159;
            if ((uVar3 & 0xfe) < 0x21) {
              uVar6 = 0x20000151;
            }
            local_38._any.signature = 0x10000149;
            if (0x10 < (uVar3 & 0xfe)) {
              local_38._any.signature = uVar6;
            }
            if (((local_48._any.signature & 7) == 1) && (0x3f < uVar3)) {
              local_48._any.signature = 0x20000151;
            }
            goto LAB_001704cd;
          }
          uVar9 = uVar8;
          if (uVar11 <= uVar8) {
            uVar9 = uVar11;
          }
          if ((local_48._any.signature & 0xf07) == 1 || (local_48._any.signature & 7) == 2) {
            if (uVar9 < 5) {
              instId = 0x18d;
              if (avxEnabled) {
                instId = 0x3df;
              }
              uVar3 = local_48._any.signature & 3;
              goto joined_r0x0017054f;
            }
            if (uVar9 == 8) {
              instId = 0x1a2;
              uVar9 = 8;
              if (avxEnabled) {
                instId = 0x3f5;
              }
              goto LAB_001704cd;
            }
          }
          if ((local_48._any.signature & 0xf07) != 0x101 && (local_48._any.signature & 7) != 2) {
            return 4;
          }
          instId = 0x18b;
          if (avxEnabled) {
            instId = 0x3de;
          }
          uVar6 = 0x40000159;
          if (uVar9 < 0x21) {
            uVar6 = 0x20000151;
          }
          local_38._any.signature = 0x10000149;
          if (0x10 < uVar9) {
            local_38._any.signature = uVar6;
          }
          uVar3 = local_48._any.signature & 3;
          goto LAB_0017030a;
        }
        uVar9 = uVar8 * 2;
        if (uVar11 <= uVar8 * 2) {
          uVar9 = uVar11;
        }
        uVar7 = 0x83;
        if (avxEnabled) {
          uVar7 = 0x324;
        }
        instId = 0x7d;
        if (avxEnabled) {
          instId = 0x318;
        }
        if (uVar9 < 9) {
          instId = uVar7;
        }
        if ((uVar9 & 0xfe) == 0x40) {
          local_38._any.signature = 0x20000151;
        }
        if ((local_48._any.signature & 7) != 1) goto LAB_001704cd;
        uVar6 = 0x40000159;
        if (uVar9 < 0x21) {
          uVar6 = 0x20000151;
        }
        uVar4 = 0x10000149;
        if (0x10 < uVar9) {
          uVar4 = uVar6;
        }
        goto LAB_00170313;
      }
      uVar9 = uVar8;
      if (uVar11 <= uVar8) {
        uVar9 = uVar11;
      }
      if ((3 < srcTypeId - 0x2d && 9 < uVar3) && ((local_48._any.signature & 7) != 2)) {
        return 4;
      }
      if (uVar9 == 1) {
        instId = 0x13f;
      }
      else if (uVar9 == 2) {
        instId = 0x142;
      }
      else {
        instId = uVar9 == 4 ^ 0x141;
      }
      if (((local_48._any.signature & 0xf07) != 1) || (4 < uVar9)) goto LAB_001704cd;
    }
    local_48._any.signature = 0x4000029;
  }
LAB_001704cd:
  if ((local_48._any.signature & 7) == 2) {
    local_48._any.signature = uVar9 << 0x18 | local_48._any.signature & 0xfffffa;
  }
  *(char **)(emitter + 0x48) = comment;
  EVar5 = CodeEmitter::emit((CodeEmitter *)emitter,instId,(Operand_ *)&local_38._any,
                            (Operand_ *)&local_48._any);
  return EVar5;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitArgMove(X86Emitter* emitter,
  const X86Reg& dst_, uint32_t dstTypeId,
  const Operand_& src_, uint32_t srcTypeId, bool avxEnabled, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (!dstTypeId) dstTypeId = x86OpData.archRegs.regTypeToTypeId[dst_.getType()];

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(dstTypeId) && !TypeId::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeId::isValid(srcTypeId) && !TypeId::isAbstract(srcTypeId));

  X86Reg dst(dst_);
  Operand src(src_);

  uint32_t dstSize = TypeId::sizeOf(dstTypeId);
  uint32_t srcSize = TypeId::sizeOf(srcTypeId);

  int32_t instId = Inst::kIdNone;

  // Not a real loop, just 'break' is nicer than 'goto'.
  for (;;) {
    if (TypeId::isInt(dstTypeId)) {
      if (TypeId::isInt(srcTypeId)) {
        instId = X86Inst::kIdMovsx;
        uint32_t typeOp = (dstTypeId << 8) | srcTypeId;

        // Sign extend by using 'movsx'.
        if (typeOp == ((TypeId::kI16 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI16) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI16)) break;

        // Sign extend by using 'movsxd'.
        instId = X86Inst::kIdMovsxd;
        if (typeOp == ((TypeId::kI64 << 8) | TypeId::kI32)) break;
      }

      if (TypeId::isInt(srcTypeId) || src_.isMem()) {
        // Zero extend by using 'movzx' or 'mov'.
        if (dstSize <= 4 && srcSize < 4) {
          instId = X86Inst::kIdMovzx;
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        }
        else {
          // We should have caught all possibilities where `srcSize` is less
          // than 4, so we don't have to worry about 'movzx' anymore. Minimum
          // size is enough to determine if we want 32-bit or 64-bit move.
          instId = X86Inst::kIdMov;
          srcSize = std::min(srcSize, dstSize);

          dst.setSignature(srcSize == 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                        : X86Reg::signatureOfT<X86Reg::kRegGpq>());
          if (src.isReg()) src.setSignature(dst.getSignature());
        }
        break;
      }

      // NOTE: The previous branch caught all memory sources, from here it's
      // always register to register conversion, so catch the remaining cases.
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isMmx(srcTypeId)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMask(srcTypeId)) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        dst.setSignature(srcSize <= 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                      : X86Reg::signatureOfT<X86Reg::kRegGpq>());
        break;
      }

      if (TypeId::isVec(srcTypeId)) {
        // 64-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isMmx(dstTypeId)) {
      instId = X86Inst::kIdMovq;
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || src.isMem()) {
        // 64-bit move.
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMmx(srcTypeId)) break;

      // NOTE: This will hurt if `avxEnabled`.
      instId = X86Inst::kIdMovdq2q;
      if (TypeId::isVec(srcTypeId)) break;
    }

    if (TypeId::isMask(dstTypeId)) {
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || TypeId::isMask(srcTypeId) || src.isMem()) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        if (X86Reg::isGp(src) && srcSize <= 4) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isVec(dstTypeId)) {
      // By default set destination to XMM, will be set to YMM|ZMM if needed.
      dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegXmm>());

      // NOTE: This will hurt if `avxEnabled`.
      if (X86Reg::isMm(src)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq2dq;
        break;
      }

      // Argument conversion.
      uint32_t dstElement = TypeId::elementOf(dstTypeId);
      uint32_t srcElement = TypeId::elementOf(srcTypeId);

      if (dstElement == TypeId::kF32 && srcElement == TypeId::kF64) {
        srcSize = std::min(dstSize * 2, srcSize);
        dstSize = srcSize / 2;

        if (srcSize <= 8)
          instId = avxEnabled ? X86Inst::kIdVcvtss2sd : X86Inst::kIdCvtss2sd;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtps2pd : X86Inst::kIdCvtps2pd;

        if (dstSize == 32)
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        if (src.isReg())
          src.setSignature(X86Reg::signatureOfVecBySize(srcSize));
        break;
      }

      if (dstElement == TypeId::kF64 && srcElement == TypeId::kF32) {
        srcSize = std::min(dstSize, srcSize * 2) / 2;
        dstSize = srcSize * 2;

        if (srcSize <= 4)
          instId = avxEnabled ? X86Inst::kIdVcvtsd2ss : X86Inst::kIdCvtsd2ss;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtpd2ps : X86Inst::kIdCvtpd2ps;

        dst.setSignature(X86Reg::signatureOfVecBySize(dstSize));
        if (src.isReg() && srcSize >= 32)
          src.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        break;
      }

      srcSize = std::min(srcSize, dstSize);
      if (X86Reg::isGp(src) || src.isMem()) {
        // 32-bit move.
        if (srcSize <= 4) {
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
          if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
          break;
        }

        // 64-bit move.
        if (srcSize == 8) {
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
          break;
        }
      }

      if (X86Reg::isVec(src) || src.isMem()) {
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
        uint32_t sign = X86Reg::signatureOfVecBySize(srcSize);

        dst.setSignature(sign);
        if (src.isReg()) src.setSignature(sign);
        break;
      }
    }

    return DebugUtils::errored(kErrorInvalidState);
  }

  if (src.isMem())
    src.as<X86Mem>().setSize(srcSize);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}